

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTypedefs.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckTypedefs(Parser *this,char *regEx,bool alignment,uint maxLength)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  uint in_ECX;
  byte in_DL;
  char *in_RSI;
  long in_RDI;
  Error error_1;
  char *localvar;
  size_t length_1;
  Error error;
  size_t sizeTypedef;
  size_t optimalCurrentLinePos;
  size_t size;
  string currentLine;
  string previousLine;
  bool reportError;
  size_t typdefline;
  size_t line;
  size_t l;
  string var;
  size_t typedefpos;
  size_t beg;
  size_t pos;
  size_t previouspos;
  size_t previousline;
  RegularExpression regex;
  bool hasError;
  char *val;
  size_t length;
  char *in_stack_fffffffffffffb18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *s;
  RegularExpression *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  Parser *in_stack_fffffffffffffb30;
  pointer in_stack_fffffffffffffb38;
  undefined1 withoutComments;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  Parser *in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  Parser *in_stack_fffffffffffffb78;
  string local_430 [8];
  size_t *in_stack_fffffffffffffbd8;
  size_t *in_stack_fffffffffffffbe0;
  size_t in_stack_fffffffffffffbe8;
  pointer in_stack_fffffffffffffbf0;
  Parser *in_stack_fffffffffffffbf8;
  pointer in_stack_fffffffffffffc10;
  Parser *local_3b8;
  size_type local_3b0;
  string local_3a8 [32];
  string local_388 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_368;
  undefined1 local_358 [40];
  size_type local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_328;
  string local_318 [32];
  string local_2f8 [39];
  byte local_2d1;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2c8;
  undefined1 local_2b8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_288;
  long local_278;
  size_t local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_268 [35];
  byte local_29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  uint local_18;
  byte local_11;
  char *local_10;
  
  local_11 = in_DL & 1;
  local_18 = in_ECX;
  local_10 = in_RSI;
  if (local_11 != 0) {
    *(undefined1 *)(in_RDI + 0x40) = 1;
    local_28._8_8_ = 0xff;
    local_28._M_allocated_capacity = (size_type)operator_new__(0xff);
    snprintf((char *)local_28._M_allocated_capacity,0xff,"Typedefs should be aligned");
    std::__cxx11::string::operator=((string *)(in_RDI + 600),(char *)local_28._M_allocated_capacity)
    ;
    if ((char *)local_28._M_allocated_capacity != (char *)0x0) {
      operator_delete__((void *)local_28._M_allocated_capacity);
    }
  }
  *(undefined1 *)(in_RDI + 0x3f) = 1;
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 0x238),"Typedefs should match regular expression: ");
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x238),local_10);
  local_29 = 0;
  kwssys::RegularExpression::RegularExpression(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  local_268[0]._M_allocated_capacity = 0;
  local_270 = 0;
  local_278 = 0;
  while (local_278 != -1) {
    local_288._8_8_ = 0;
    local_288._M_allocated_capacity = 0;
    std::__cxx11::string::size();
    s = &local_288;
    FindTypedef_abi_cxx11_
              (in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8
               ,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,&in_stack_fffffffffffffc10->line
              );
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      if ((local_11 & 1) != 0) {
        local_2c8._8_8_ =
             GetPositionInLine(in_stack_fffffffffffffb30,
                               CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        local_2c8._M_allocated_capacity =
             GetLineNumber(in_stack_fffffffffffffb48,
                           CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                           SUB81((ulong)in_stack_fffffffffffffb38 >> 0x38,0));
        local_2d0 = GetLineNumber(in_stack_fffffffffffffb48,
                                  CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                                  SUB81((ulong)in_stack_fffffffffffffb38 >> 0x38,0));
        if (local_2d0 - local_268[0]._0_8_ < 2) {
          if (local_2c8._8_8_ != local_270) {
            local_2d1 = 1;
            GetLineNumber(in_stack_fffffffffffffb48,
                          CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                          SUB81((ulong)in_stack_fffffffffffffb38 >> 0x38,0));
            GetLine_abi_cxx11_(in_stack_fffffffffffffb78,
                               CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
            GetLineNumber(in_stack_fffffffffffffb48,
                          CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                          SUB81((ulong)in_stack_fffffffffffffb38 >> 0x38,0));
            GetLine_abi_cxx11_(in_stack_fffffffffffffb78,
                               CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
            std::__cxx11::string::size();
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_2f8);
            if (*pcVar3 != ';') {
              in_stack_fffffffffffffb78 = (Parser *)std::__cxx11::string::size();
              lVar4 = std::__cxx11::string::size();
              if ((undefined1 *)(ulong)local_18 <
                  in_stack_fffffffffffffb78->m_TestsDone + lVar4 + -0x30) {
                local_2d1 = 0;
              }
            }
            lVar4 = std::__cxx11::string::size();
            local_328._8_8_ = lVar4 - local_2c8._8_8_;
            if ((ulong)local_18 < local_270 + local_328._8_8_) {
              local_270 = local_2c8._8_8_;
              local_2d1 = 0;
            }
            local_328._M_allocated_capacity = local_2c8._8_8_;
            while( true ) {
              in_stack_fffffffffffffb77 = false;
              if (1 < local_328._M_allocated_capacity) {
                in_stack_fffffffffffffb68 =
                     (char *)std::__cxx11::string::operator[]((ulong)local_318);
                in_stack_fffffffffffffb77 = *in_stack_fffffffffffffb68 == ' ';
              }
              if ((bool)in_stack_fffffffffffffb77 == false) break;
              local_328._M_allocated_capacity = local_328._M_allocated_capacity - 1;
            }
            local_328._M_allocated_capacity = local_328._M_allocated_capacity + 1;
            lVar4 = std::__cxx11::string::size();
            local_330 = lVar4 - local_270;
            if ((ulong)local_18 < local_328._M_allocated_capacity + local_330) {
              local_270 = local_2c8._8_8_;
              local_2d1 = 0;
            }
            if ((local_2d1 & 1) != 0) {
              ErrorStruct::ErrorStruct((ErrorStruct *)0x1a312b);
              in_stack_fffffffffffffb60 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   GetLineNumber(in_stack_fffffffffffffb48,
                                 CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                                 SUB81((ulong)in_stack_fffffffffffffb38 >> 0x38,0));
              local_358._0_8_ = 0x10;
              local_368._M_allocated_capacity = (size_type)in_stack_fffffffffffffb60;
              local_368._8_8_ = in_stack_fffffffffffffb60;
              std::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                             (char *)in_stack_fffffffffffffb20);
              std::__cxx11::string::operator=((string *)(local_358 + 8),local_388);
              std::__cxx11::string::~string(local_388);
              std::__cxx11::string::~string(local_3a8);
              local_3b0 = 10;
              local_3b8 = (Parser *)operator_new__(10);
              snprintf((char *)local_3b8,10,"%zd",local_2c8._8_8_);
              std::__cxx11::string::operator+=((string *)(local_358 + 8),(char *)local_3b8);
              std::__cxx11::string::operator+=((string *)(local_358 + 8)," v.s. ");
              snprintf((char *)local_3b8,10,"%zd",local_270);
              std::__cxx11::string::operator+=((string *)(local_358 + 8),(char *)local_3b8);
              in_stack_fffffffffffffb48 = local_3b8;
              if (local_3b8 != (Parser *)0x0) {
                operator_delete__(local_3b8);
              }
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&in_stack_fffffffffffffb30->m_ErrorList,
                         (value_type *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28)
                        );
              local_29 = 1;
              ErrorStruct::~ErrorStruct((ErrorStruct *)0x1a32df);
            }
            std::__cxx11::string::~string(local_318);
            std::__cxx11::string::~string(local_2f8);
          }
        }
        else {
          local_270 = local_2c8._8_8_;
        }
        local_268[0]._M_allocated_capacity = local_2c8._M_allocated_capacity;
      }
      in_stack_fffffffffffffb47 =
           kwssys::RegularExpression::find(in_stack_fffffffffffffb20,(string *)s);
      withoutComments = (undefined1)((ulong)in_stack_fffffffffffffb38 >> 0x38);
      if (!(bool)in_stack_fffffffffffffb47) {
        ErrorStruct::ErrorStruct((ErrorStruct *)0x1a33ba);
        in_stack_fffffffffffffb38 =
             (pointer)GetLineNumber(in_stack_fffffffffffffb48,
                                    CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                                    (bool)withoutComments);
        in_stack_fffffffffffffc10 = in_stack_fffffffffffffb38;
        std::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                       (char *)in_stack_fffffffffffffb20);
        in_stack_fffffffffffffb30 = (Parser *)&stack0xfffffffffffffbf0;
        std::__cxx11::string::operator=
                  ((string *)&stack0xfffffffffffffc28,(string *)in_stack_fffffffffffffb30);
        std::__cxx11::string::~string((string *)in_stack_fffffffffffffb30);
        std::__cxx11::string::~string(local_430);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&in_stack_fffffffffffffb30->m_ErrorList,
                   (value_type *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        local_29 = 1;
        ErrorStruct::~ErrorStruct((ErrorStruct *)0x1a349d);
      }
      local_2b8._0_4_ = 0;
    }
    else {
      local_2b8._0_4_ = 2;
    }
    std::__cxx11::string::~string((string *)(local_2b8 + 0x10));
  }
  bVar1 = local_29 ^ 0xff;
  local_2b8._0_4_ = 1;
  kwssys::RegularExpression::~RegularExpression(in_stack_fffffffffffffb20);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Parser::CheckTypedefs(const char* regEx, bool alignment,unsigned int maxLength)
{
  if(alignment)
    {
    m_TestsDone[TYPEDEF_ALIGN] = true;
    constexpr size_t length = 255;
    char* val = new char[length];
    snprintf(val,length,"Typedefs should be aligned");
    m_TestsDescription[TYPEDEF_ALIGN] = val;
    delete [] val;
    }

  m_TestsDone[TYPEDEF_REGEX] = true;
  m_TestsDescription[TYPEDEF_REGEX] = "Typedefs should match regular expression: ";
  m_TestsDescription[TYPEDEF_REGEX] += regEx;

  // First we need to find the typedefs
  // typedef type MyTypeDef;
  bool hasError = false;

  kwssys::RegularExpression regex(regEx);

  size_t previousline = 0;
  size_t previouspos = 0;
  size_t pos = 0;
  while(pos!= std::string::npos)
    {
    size_t beg = 0;
    size_t typedefpos = 0;
    std::string var = this->FindTypedef(pos+1,m_BufferNoComment.size(),pos,beg,typedefpos);

    if (var.empty()) {
      continue;
    }
    // Check the alignment if specified
    if(alignment)
      {
      // Find the position in the line
      size_t l = this->GetPositionInLine(beg);
      size_t line = this->GetLineNumber(beg,true);
      size_t typdefline = this->GetLineNumber(typedefpos,true);

      // if the typedef is on a line close to the previous one we check
      if(typdefline-previousline<2)
        {
        if(l!=previouspos)
          {
          bool reportError = true;
          // We check that the previous line is not ending with a semicolon
          // and that the sum of the two lines is more than maxLength
          std::string previousLine = this->GetLine(this->GetLineNumber(beg,true)-2);
          std::string currentLine = this->GetLine(this->GetLineNumber(beg,true)-1);
          if( (previousLine[previousLine.size()-1] != ';')
             && (previousLine.size()+currentLine.size()>maxLength)
            )
            {
            reportError = false;
            }

          // Check if the alignement is possible due to the length of the line
          size_t size = currentLine.size()-l;
          if(previouspos+size>maxLength)
            {
            previouspos = l;
            reportError = false;
            }

          // This one is a bit tricky. Check the minimum
          // typedef igstk::VascularNetworkObject   VascularNetworkObjectType;
          // typedef VascularNetworkObjectType::VesselObjectType VesselObjectType;
          // First find the optimal position (one space) for the current line
          size_t optimalCurrentLinePos = l;
          while(optimalCurrentLinePos>1 && currentLine[optimalCurrentLinePos-1] == ' ')
            {
            optimalCurrentLinePos--;
            }
          optimalCurrentLinePos++;
          // Second find the size of the previous typedefs;
          size_t sizeTypedef = previousLine.size()-previouspos;
          // if the size is too big we don't report
          if(optimalCurrentLinePos+sizeTypedef>maxLength)
            {
            previouspos = l;
            reportError = false;
            }

          if(reportError)
            {
            Error error;
            error.line = this->GetLineNumber(beg,true);
            error.line2 = error.line;
            error.number = TYPEDEF_ALIGN;
            error.description = "Type definition (" + var + ") is not aligned with the previous one: ";
            constexpr size_t length = 10;
            char* localvar = new char[length];
            snprintf(localvar,length,"%zd",l);
            error.description += localvar;
            error.description += " v.s. ";
            snprintf(localvar,length,"%zd",previouspos);
            error.description += localvar;
            delete [] localvar;
            m_ErrorList.push_back(error);
            hasError = true;
            }
          }
        }
      else
        {
        previouspos = l;
        }
      previousline = line;
      }

    if(!regex.find(var))
      {
      Error error;
      error.line = this->GetLineNumber(pos,true);
      error.line2 = error.line;
      error.number = TYPEDEF_REGEX;
      error.description = "Type definition (" + var + ") doesn't match regular expression";
      m_ErrorList.push_back(error);
      hasError = true;
      }
    }
  return !hasError;
}